

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O3

void duckdb::AggregateExecutor::UnaryScatter<duckdb::BoolState,bool,duckdb::BoolOrFunFunction>
               (Vector *input,Vector *states,AggregateInputData *aggr_input_data,idx_t count)

{
  unsigned_long *puVar1;
  data_ptr_t pdVar2;
  undefined1 *puVar3;
  sel_t *psVar4;
  sel_t *psVar5;
  data_ptr_t pdVar6;
  ulong uVar7;
  undefined1 uVar8;
  ulong uVar9;
  ulong uVar10;
  idx_t iVar11;
  ulong uVar12;
  ulong uVar13;
  idx_t iVar14;
  idx_t iVar15;
  ulong uVar16;
  UnifiedVectorFormat idata;
  UnifiedVectorFormat sdata;
  UnifiedVectorFormat local_c0;
  UnifiedVectorFormat local_78;
  
  if (input->vector_type == FLAT_VECTOR) {
    if (states->vector_type == FLAT_VECTOR) {
      pdVar2 = input->data;
      pdVar6 = states->data;
      FlatVector::VerifyFlatVector(input);
      puVar1 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        if (count == 0) {
          return;
        }
        iVar11 = 0;
        do {
          puVar3 = *(undefined1 **)(pdVar6 + iVar11 * 8);
          *puVar3 = 0;
          uVar8 = puVar3[1];
          if (pdVar2[iVar11] != '\0') {
            uVar8 = 1;
          }
          puVar3[1] = uVar8;
          iVar11 = iVar11 + 1;
        } while (count != iVar11);
        return;
      }
      if (count + 0x3f < 0x40) {
        return;
      }
      uVar9 = 0;
      uVar12 = 0;
      do {
        uVar7 = puVar1[uVar9];
        uVar10 = uVar12 + 0x40;
        if (count <= uVar12 + 0x40) {
          uVar10 = count;
        }
        uVar13 = uVar10;
        if (uVar7 != 0) {
          uVar13 = uVar12;
          if (uVar7 == 0xffffffffffffffff) {
            if (uVar12 < uVar10) {
              do {
                puVar3 = *(undefined1 **)(pdVar6 + uVar12 * 8);
                *puVar3 = 0;
                uVar8 = puVar3[1];
                if (pdVar2[uVar12] != '\0') {
                  uVar8 = 1;
                }
                puVar3[1] = uVar8;
                uVar12 = uVar12 + 1;
                uVar13 = uVar10;
              } while (uVar10 != uVar12);
            }
          }
          else if (uVar12 < uVar10) {
            uVar16 = 0;
            do {
              if ((uVar7 >> (uVar16 & 0x3f) & 1) != 0) {
                puVar3 = *(undefined1 **)(pdVar6 + uVar16 * 8 + uVar12 * 8);
                *puVar3 = 0;
                uVar8 = puVar3[1];
                if (pdVar2[uVar16 + uVar12] != '\0') {
                  uVar8 = 1;
                }
                puVar3[1] = uVar8;
              }
              uVar16 = uVar16 + 1;
              uVar13 = uVar10;
            } while (uVar10 - uVar12 != uVar16);
          }
        }
        uVar9 = uVar9 + 1;
        uVar12 = uVar13;
      } while (uVar9 != count + 0x3f >> 6);
      return;
    }
  }
  else if ((input->vector_type == CONSTANT_VECTOR) && (states->vector_type == CONSTANT_VECTOR)) {
    puVar1 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if ((puVar1 != (unsigned_long *)0x0) && ((*puVar1 & 1) == 0)) {
      return;
    }
    if (count == 0) {
      return;
    }
    pdVar2 = input->data;
    puVar3 = *(undefined1 **)states->data;
    uVar8 = puVar3[1];
    do {
      *puVar3 = 0;
      if (*pdVar2 != '\0') {
        uVar8 = 1;
      }
      puVar3[1] = uVar8;
      count = count - 1;
    } while (count != 0);
    return;
  }
  UnifiedVectorFormat::UnifiedVectorFormat(&local_c0);
  UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
  Vector::ToUnifiedFormat(input,count,&local_c0);
  Vector::ToUnifiedFormat(states,count,&local_78);
  if (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
      (unsigned_long *)0x0) {
    if (count != 0) {
      psVar4 = (local_c0.sel)->sel_vector;
      psVar5 = (local_78.sel)->sel_vector;
      iVar11 = 0;
      do {
        iVar14 = iVar11;
        if (psVar4 != (sel_t *)0x0) {
          iVar14 = (idx_t)psVar4[iVar11];
        }
        iVar15 = iVar11;
        if (psVar5 != (sel_t *)0x0) {
          iVar15 = (idx_t)psVar5[iVar11];
        }
        puVar3 = *(undefined1 **)(local_78.data + iVar15 * 8);
        *puVar3 = 0;
        uVar8 = puVar3[1];
        if (local_c0.data[iVar14] != '\0') {
          uVar8 = 1;
        }
        puVar3[1] = uVar8;
        iVar11 = iVar11 + 1;
      } while (count != iVar11);
    }
  }
  else if (count != 0) {
    psVar4 = (local_c0.sel)->sel_vector;
    psVar5 = (local_78.sel)->sel_vector;
    iVar11 = 0;
    do {
      iVar14 = iVar11;
      if (psVar4 != (sel_t *)0x0) {
        iVar14 = (idx_t)psVar4[iVar11];
      }
      iVar15 = iVar11;
      if (psVar5 != (sel_t *)0x0) {
        iVar15 = (idx_t)psVar5[iVar11];
      }
      if ((local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[iVar14 >> 6]
           >> (iVar14 & 0x3f) & 1) != 0) {
        puVar3 = *(undefined1 **)(local_78.data + iVar15 * 8);
        *puVar3 = 0;
        uVar8 = puVar3[1];
        if (local_c0.data[iVar14] != '\0') {
          uVar8 = 1;
        }
        puVar3[1] = uVar8;
      }
      iVar11 = iVar11 + 1;
    } while (count != iVar11);
  }
  if (local_78.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_c0.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c0.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

static void UnaryScatter(Vector &input, Vector &states, AggregateInputData &aggr_input_data, idx_t count) {
		if (input.GetVectorType() == VectorType::CONSTANT_VECTOR &&
		    states.GetVectorType() == VectorType::CONSTANT_VECTOR) {
			if (OP::IgnoreNull() && ConstantVector::IsNull(input)) {
				// constant NULL input in function that ignores NULL values
				return;
			}
			// regular constant: get first state
			auto idata = ConstantVector::GetData<INPUT_TYPE>(input);
			auto sdata = ConstantVector::GetData<STATE_TYPE *>(states);
			AggregateUnaryInput input_data(aggr_input_data, ConstantVector::Validity(input));
			OP::template ConstantOperation<INPUT_TYPE, STATE_TYPE, OP>(**sdata, *idata, input_data, count);
#ifndef DUCKDB_SMALLER_BINARY
		} else if (input.GetVectorType() == VectorType::FLAT_VECTOR &&
		           states.GetVectorType() == VectorType::FLAT_VECTOR) {
			auto idata = FlatVector::GetData<INPUT_TYPE>(input);
			auto sdata = FlatVector::GetData<STATE_TYPE *>(states);
			UnaryFlatLoop<STATE_TYPE, INPUT_TYPE, OP>(idata, aggr_input_data, sdata, FlatVector::Validity(input),
			                                          count);
#endif
		} else {
			UnifiedVectorFormat idata, sdata;
			input.ToUnifiedFormat(count, idata);
			states.ToUnifiedFormat(count, sdata);
			UnaryScatterLoop<STATE_TYPE, INPUT_TYPE, OP>(UnifiedVectorFormat::GetData<INPUT_TYPE>(idata),
			                                             aggr_input_data, (STATE_TYPE **)sdata.data, *idata.sel,
			                                             *sdata.sel, idata.validity, count);
		}
	}